

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume_mesh_scalar_quantity.cpp
# Opt level: O0

void __thiscall
polyscope::VolumeMeshVertexScalarQuantity::setEnabledLevelSet
          (VolumeMeshVertexScalarQuantity *this,bool v)

{
  byte in_SIL;
  VolumeMeshVertexScalarQuantity *in_RDI;
  
  if ((in_SIL & 1) == 0) {
    in_RDI->isDrawingLevelSet = false;
    VolumeMesh::setLevelSetQuantity
              ((in_RDI->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
               super_QuantityS<polyscope::VolumeMesh>.parent,(VolumeMeshVertexScalarQuantity *)0x0);
  }
  else {
    in_RDI->isDrawingLevelSet = true;
    (*(in_RDI->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
      super_QuantityS<polyscope::VolumeMesh>.super_Quantity._vptr_Quantity[9])(in_RDI,1);
    VolumeMesh::setLevelSetQuantity
              ((in_RDI->super_VolumeMeshScalarQuantity).super_VolumeMeshQuantity.
               super_QuantityS<polyscope::VolumeMesh>.parent,in_RDI);
  }
  return;
}

Assistant:

void VolumeMeshVertexScalarQuantity::setEnabledLevelSet(bool v) {
  if (v) {
    isDrawingLevelSet = true;
    setEnabled(true);
    parent.setLevelSetQuantity(this);
  } else {
    isDrawingLevelSet = false;
    parent.setLevelSetQuantity(nullptr);
  }
}